

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O2

int __thiscall QTextFragment::position(QTextFragment *this)

{
  uint uVar1;
  
  if ((this->p != (QTextDocumentPrivate *)0x0) && (this->n != 0)) {
    uVar1 = QFragmentMapData<QTextFragmentData>::position(&(this->p->fragments).data,this->n,0);
    return uVar1;
  }
  return 0;
}

Assistant:

int QTextFragment::position() const
{
    if (!p || !n)
        return 0; // ### -1 instead?

    return p->fragmentMap().position(n);
}